

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O1

void ST::apply_format<int,double,char_const(&)[4]>
               (format_writer *data,int *arg0,double *args,char (*args_1) [4])

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  out_of_range *this;
  undefined8 uVar4;
  char (**ppacVar5) [4];
  ulong uVar6;
  long lVar7;
  formatter_ref_t formatters [3];
  format_spec spec;
  ulong local_a8 [2];
  code *local_98 [2];
  double local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  char (*local_68) [4];
  undefined8 uStack_60;
  char (*local_58) [4];
  code *pcStack_50;
  format_spec local_3c;
  
  local_a8[1] = 0;
  local_a8[0] = (ulong)(uint)*arg0;
  local_98[1] = std::
                _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                ::_M_invoke;
  local_98[0] = std::
                _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
                ::_M_manager;
  local_88 = *args;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
             ::_M_manager;
  uStack_60 = 0;
  pcStack_50 = std::
               _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
               ::_M_invoke;
  local_58 = (char (*) [4])
             std::
             _Function_handler<void_(const_ST::format_spec_&,_ST::format_writer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_formatter.h:307:16)>
             ::_M_manager;
  uVar6 = 0;
  local_68 = args_1;
  while( true ) {
    bVar2 = format_writer::next_format(data);
    if (!bVar2) {
      lVar7 = -0x60;
      ppacVar5 = &local_68;
      do {
        if (ppacVar5[2] != (char (*) [4])0x0) {
          (*(code *)ppacVar5[2])(ppacVar5,ppacVar5,3);
        }
        ppacVar5 = ppacVar5 + -4;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      return;
    }
    format_writer::parse_format(&local_3c,data);
    iVar1 = local_3c.arg_index;
    uVar3 = (long)local_3c.arg_index - 1;
    if ((long)local_3c.arg_index < 0) {
      uVar3 = uVar6;
    }
    if (2 < uVar3) break;
    if (local_98[uVar3 * 4] == (code *)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __cxa_free_exception(&local_3c);
      lVar7 = -0x60;
      ppacVar5 = &local_68;
      do {
        if (ppacVar5[2] != (char (*) [4])0x0) {
          (*(code *)ppacVar5[2])(ppacVar5,ppacVar5,3);
        }
        ppacVar5 = ppacVar5 + -4;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      _Unwind_Resume(uVar4);
    }
    (*local_98[uVar3 * 4 + 1])(local_a8 + uVar3 * 4,&local_3c,data);
    uVar6 = uVar6 + ((uint)iVar1 >> 0x1f);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }